

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void cimg_library::CImg<unsigned_char>::_load_inr_header(FILE *file,int *out,float *voxel_size)

{
  int iVar1;
  char *pcVar2;
  CImgIOException *pCVar3;
  char *__src;
  bool bVar4;
  undefined1 local_90 [8];
  CImg<char> tmp2;
  undefined1 local_60 [8];
  CImg<char> tmp1;
  CImg<char> item;
  float *voxel_size_local;
  int *out_local;
  FILE *file_local;
  
  CImg<char>::CImg((CImg<char> *)&tmp1._data,0x400,1,1,1);
  CImg<char>::CImg((CImg<char> *)local_60,0x40,1,1,1);
  CImg<char>::CImg((CImg<char> *)local_90,0x40,1,1,1);
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_90);
  *pcVar2 = '\0';
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
  *pcVar2 = '\0';
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
  *pcVar2 = '\0';
  iVar1 = __isoc99_fscanf(file,"%63s",item._16_8_);
  *out = iVar1;
  out[5] = 1;
  out[3] = 1;
  out[2] = 1;
  out[1] = 1;
  *out = 1;
  out[7] = -1;
  out[6] = -1;
  out[4] = -1;
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
  iVar1 = cimg::strncasecmp(pcVar2,"#INRIMAGE-4#{",0xd);
  if (iVar1 != 0) {
    pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar2 = pixel_type();
    CImgIOException::CImgIOException
              (pCVar3,"CImg<%s>::load_inr(): INRIMAGE-4 header not found.",pcVar2);
    __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  do {
    do {
      iVar1 = __isoc99_fscanf(file," %63[^\n]%*c",item._16_8_);
      bVar4 = false;
      if (iVar1 != -1) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
        iVar1 = strncmp(pcVar2,"##}",3);
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) {
        if ((((*out < 0) || (out[1] < 0)) || (out[2] < 0)) || (out[3] < 0)) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,
                     "CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                     pcVar2,(ulong)(uint)*out,(ulong)(uint)out[1],(ulong)(uint)out[2],out[3]);
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if ((out[4] < 0) || (out[5] < 0)) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,"CImg<%s>::load_inr(): Incomplete pixel type defined in header.",pcVar2)
          ;
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if (out[6] < 0) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,"CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                     pcVar2);
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if (out[7] < 0) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,
                     "CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                     pcVar2);
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        CImg<char>::~CImg((CImg<char> *)local_90);
        CImg<char>::~CImg((CImg<char> *)local_60);
        CImg<char>::~CImg((CImg<char> *)&tmp1._data);
        return;
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      __isoc99_sscanf(pcVar2," XDIM%*[^0-9]%d",out);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      __isoc99_sscanf(pcVar2," YDIM%*[^0-9]%d",out + 1);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      __isoc99_sscanf(pcVar2," ZDIM%*[^0-9]%d",out + 2);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      __isoc99_sscanf(pcVar2," VDIM%*[^0-9]%d",out + 3);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      __isoc99_sscanf(pcVar2," PIXSIZE%*[^0-9]%d",out + 6);
      if (voxel_size != (float *)0x0) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
        __isoc99_sscanf(pcVar2," VX%*[^0-9.+-]%f",voxel_size);
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
        __isoc99_sscanf(pcVar2," VY%*[^0-9.+-]%f",voxel_size + 1);
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
        __isoc99_sscanf(pcVar2," VZ%*[^0-9.+-]%f",voxel_size + 2);
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      iVar1 = __isoc99_sscanf(pcVar2," CPU%*[ =]%s",tmp1._16_8_);
      if (iVar1 != 0) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
        iVar1 = cimg::strncasecmp(pcVar2,"sun",3);
        out[7] = (uint)(iVar1 == 0);
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp1._data);
      iVar1 = __isoc99_sscanf(pcVar2," TYPE%*[ =]%s %s",tmp1._16_8_,tmp2._16_8_);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      if (iVar1 != 2) break;
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
      iVar1 = cimg::strncasecmp(pcVar2,"unsigned",8);
      out[5] = (uint)(iVar1 != 0);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
      __src = cimg_library::CImg::operator_cast_to_char_((CImg *)local_90);
      strncpy(pcVar2,__src,(ulong)(local_60._0_4_ - 1));
    }
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
    iVar1 = cimg::strncasecmp(pcVar2,"int",3);
    if (iVar1 == 0) {
LAB_002028ac:
      out[4] = 0;
    }
    else {
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
      iVar1 = cimg::strncasecmp(pcVar2,"fixed",5);
      if (iVar1 == 0) goto LAB_002028ac;
    }
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
    iVar1 = cimg::strncasecmp(pcVar2,"float",5);
    if (iVar1 == 0) {
LAB_002028fb:
      out[4] = 1;
    }
    else {
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
      iVar1 = cimg::strncasecmp(pcVar2,"double",6);
      if (iVar1 == 0) goto LAB_002028fb;
    }
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_60);
    iVar1 = cimg::strncasecmp(pcVar2,"packed",6);
    if (iVar1 == 0) {
      out[4] = 2;
    }
  } while (-1 < out[4]);
  pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
  pcVar2 = pixel_type();
  CImgIOException::CImgIOException
            (pCVar3,"CImg<%s>::load_inr(): Invalid pixel type \'%s\' defined in header.",pcVar2,
             tmp2._16_8_);
  __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

static void _load_inr_header(std::FILE *file, int out[8], float *const voxel_size) {
      CImg<charT> item(1024), tmp1(64), tmp2(64);
      *item = *tmp1 = *tmp2 = 0;
      out[0] = std::fscanf(file,"%63s",item._data);
      out[0] = out[1] = out[2] = out[3] = out[5] = 1; out[4] = out[6] = out[7] = -1;
      if (cimg::strncasecmp(item,"#INRIMAGE-4#{",13)!=0)
        throw CImgIOException("CImg<%s>::load_inr(): INRIMAGE-4 header not found.",
                              pixel_type());

      while (std::fscanf(file," %63[^\n]%*c",item._data)!=EOF && std::strncmp(item,"##}",3)) {
        cimg_sscanf(item," XDIM%*[^0-9]%d",out);
        cimg_sscanf(item," YDIM%*[^0-9]%d",out + 1);
        cimg_sscanf(item," ZDIM%*[^0-9]%d",out + 2);
        cimg_sscanf(item," VDIM%*[^0-9]%d",out + 3);
        cimg_sscanf(item," PIXSIZE%*[^0-9]%d",out + 6);
        if (voxel_size) {
          cimg_sscanf(item," VX%*[^0-9.+-]%f",voxel_size);
          cimg_sscanf(item," VY%*[^0-9.+-]%f",voxel_size + 1);
          cimg_sscanf(item," VZ%*[^0-9.+-]%f",voxel_size + 2);
        }
        if (cimg_sscanf(item," CPU%*[ =]%s",tmp1._data)) out[7] = cimg::strncasecmp(tmp1,"sun",3)?0:1;
        switch (cimg_sscanf(item," TYPE%*[ =]%s %s",tmp1._data,tmp2._data)) {
        case 0 : break;
        case 2 :
          out[5] = cimg::strncasecmp(tmp1,"unsigned",8)?1:0;
          std::strncpy(tmp1,tmp2,tmp1._width - 1); // fallthrough
        case 1 :
          if (!cimg::strncasecmp(tmp1,"int",3) || !cimg::strncasecmp(tmp1,"fixed",5))  out[4] = 0;
          if (!cimg::strncasecmp(tmp1,"float",5) || !cimg::strncasecmp(tmp1,"double",6)) out[4] = 1;
          if (!cimg::strncasecmp(tmp1,"packed",6)) out[4] = 2;
          if (out[4]>=0) break; // fallthrough
        default :
          throw CImgIOException("CImg<%s>::load_inr(): Invalid pixel type '%s' defined in header.",
                                pixel_type(),
                                tmp2._data);
        }
      }
      if (out[0]<0 || out[1]<0 || out[2]<0 || out[3]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                              pixel_type(),
                              out[0],out[1],out[2],out[3]);
      if (out[4]<0 || out[5]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                              pixel_type());
      if (out[6]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                              pixel_type());
      if (out[7]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                              pixel_type());
    }